

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  _Bool _Var4;
  size_t n;
  long lVar5;
  uint uVar6;
  size_t n_1;
  uint32_t letter_counts [26];
  char word [1024];
  int aiStack_58c [63];
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  byte local_418;
  byte local_417 [1023];
  
  local_438 = 0;
  uStack_430 = 0;
  local_448 = 0;
  uStack_440 = 0;
  local_458 = 0;
  uStack_450 = 0;
  local_468 = 0;
  uStack_460 = 0;
  local_478 = 0;
  uStack_470 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_428 = 0;
  uStack_490 = 0x1011c5;
  _Var4 = ask_word((char *)&local_418,6,0x400);
  uVar6 = 0;
  if (_Var4) {
    pbVar3 = local_417;
    bVar1 = local_418;
    do {
      while (bVar1 != 0) {
        if ((byte)(bVar1 + 0xbf) < 0x1a) {
          aiStack_58c[bVar1] = aiStack_58c[bVar1] + 1;
        }
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      }
      uStack_490 = 0x10120d;
      _Var4 = ask_word((char *)&local_418,6,0x400);
      pbVar3 = local_417;
      bVar1 = local_418;
    } while (_Var4);
    uVar6 = (uint)local_488;
  }
  lVar5 = 0;
  do {
    uVar2 = *(uint *)((long)&local_488 + lVar5 * 4);
    if (uVar6 < uVar2) {
      uVar6 = uVar2;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1a);
  uStack_490 = 0x101235;
  printf("The most used letters are ");
  lVar5 = 0;
  do {
    if (*(uint *)((long)&local_488 + lVar5 * 4) == uVar6) {
      uStack_490 = 0x101253;
      printf("%c ",(ulong)((int)lVar5 + 0x41));
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x1a);
  uStack_490 = 0x10126c;
  printf("\nEach are used %u times.\n",(ulong)uVar6);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  char word[1024];
  uint32_t letter_counts[26];

  for (size_t n = 0; n < 26; n++) letter_counts[n] = 0;

  while (ask_word(word, 6, sizeof word)) {
    count_letters(letter_counts, word);
  }

  uint32_t max = max_count(letter_counts);

  printf("The most used letters are ");
  for (size_t n = 0; n < 26; n++) {
    if (letter_counts[n] == max) printf("%c ", 'A' + (char)n);
  }
  printf("\nEach are used %" PRIu32 " times.\n", max);

  return 0;
}